

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O3

void highwayhash::CountingSort<unsigned_int>(uint *begin,uint *end)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  _Var6;
  ulong uVar7;
  pair<unsigned_int,_int> *value_count;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> unique;
  undefined1 local_48 [16];
  long local_38;
  pair<unsigned_int,_int> local_30;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  if (begin == end) {
    local_48._0_8_ = (uint *)0x0;
  }
  else {
    puVar10 = begin;
    do {
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_pred<highwayhash::CountingSort<unsigned_int>(unsigned_int*,unsigned_int*)::_lambda(std::pair<unsigned_int,int>const&)_1_>>
                        (local_48._0_8_,local_48._8_8_,*puVar10);
      if (_Var6._M_current == (pair<unsigned_int,_int> *)local_48._8_8_) {
        local_30 = (pair<unsigned_int,_int>)((ulong)*puVar10 | 0x100000000);
        std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
        emplace_back<std::pair<unsigned_int,int>>
                  ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>
                    *)local_48,&local_30);
      }
      else {
        (_Var6._M_current)->second = (_Var6._M_current)->second + 1;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != end);
    uVar5 = local_48._0_8_;
    if (local_48._0_8_ != local_48._8_8_) {
      uVar7 = (long)(local_48._8_8_ - local_48._0_8_) >> 3;
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48._0_8_,local_48._8_8_,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar5);
    }
  }
  auVar4 = _DAT_001082a0;
  auVar3 = _DAT_00108290;
  auVar2 = _DAT_00108230;
  for (puVar10 = (uint *)local_48._0_8_; puVar10 != (uint *)local_48._8_8_; puVar10 = puVar10 + 2) {
    if ((long)(int)puVar10[1] == 0) {
      lVar9 = 0;
    }
    else {
      uVar1 = *puVar10;
      uVar7 = (long)(int)puVar10[1] + 0x3fffffffffffffff;
      uVar8 = uVar7 & 0x3fffffffffffffff;
      auVar11._8_4_ = (int)uVar8;
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = (int)(uVar8 >> 0x20);
      auVar11 = auVar11 ^ auVar2;
      lVar9 = 0;
      do {
        auVar13._8_4_ = (int)lVar9;
        auVar13._0_8_ = lVar9;
        auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar14 = (auVar13 | auVar4) ^ auVar2;
        iVar12 = auVar11._4_4_;
        if ((bool)(~(iVar12 < auVar14._4_4_ ||
                    auVar11._0_4_ < auVar14._0_4_ && auVar14._4_4_ == iVar12) & 1)) {
          begin[lVar9] = uVar1;
        }
        if (auVar14._12_4_ <= auVar11._12_4_ &&
            (auVar14._8_4_ <= auVar11._8_4_ || auVar14._12_4_ != auVar11._12_4_)) {
          begin[lVar9 + 1] = uVar1;
        }
        auVar13 = (auVar13 | auVar3) ^ auVar2;
        iVar15 = auVar13._4_4_;
        if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
          begin[lVar9 + 2] = uVar1;
          begin[lVar9 + 3] = uVar1;
        }
        lVar9 = lVar9 + 4;
      } while ((uVar8 - ((uint)uVar7 & 3)) + 4 != lVar9);
      lVar9 = (long)(int)puVar10[1];
    }
    begin = begin + lVar9;
  }
  if (begin != end) {
    __assert_fail("p == end",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                  ,0x68,"void highwayhash::CountingSort(T *, T *) [T = unsigned int]");
  }
  if ((uint *)local_48._0_8_ != (uint *)0x0) {
    operator_delete((void *)local_48._0_8_,local_38 - local_48._0_8_);
  }
  return;
}

Assistant:

void CountingSort(T* begin, T* end) {
  // Unique values and their frequency (similar to flat_map).
  using Unique = std::pair<T, int>;
  std::vector<Unique> unique;
  for (const T* p = begin; p != end; ++p) {
    const T value = *p;
    const auto pos =
        std::find_if(unique.begin(), unique.end(),
                     [value](const Unique& u) { return u.first == value; });
    if (pos == unique.end()) {
      unique.push_back(std::make_pair(*p, 1));
    } else {
      ++pos->second;
    }
  }

  // Sort in ascending order of value (pair.first).
  std::sort(unique.begin(), unique.end());

  // Write that many copies of each unique value to the array.
  T* HH_RESTRICT p = begin;
  for (const auto& value_count : unique) {
    std::fill(p, p + value_count.second, value_count.first);
    p += value_count.second;
  }
  assert(p == end);
}